

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MatchAndExplain(MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
                 MatchResultListener *listener)

{
  MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  int iVar2;
  string asStack_38 [32];
  
  pMVar1 = this->impl_;
  std::__cxx11::string::string(asStack_38,(string *)x);
  iVar2 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,asStack_38,listener);
  std::__cxx11::string::~string(asStack_38);
  return SUB41(iVar2,0);
}

Assistant:

virtual bool MatchAndExplain(const T& x,
                               MatchResultListener* listener) const {
    return impl_->MatchAndExplain(x, listener);
  }